

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O0

FileFlags __thiscall QResourceFileEngine::fileFlags(QResourceFileEngine *this,FileFlags type)

{
  bool bVar1;
  long in_FS_OFFSET;
  QResourceFileEnginePrivate *d;
  FileFlags ret;
  FileFlag in_stack_ffffffffffffff8c;
  enum_type in_stack_ffffffffffffff90;
  enum_type in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  uint uVar2;
  QFlagsStorage<QAbstractFileEngine::FileFlag> in_stack_ffffffffffffff9c;
  QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4> local_24;
  QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4> local_20;
  QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4> local_1c;
  QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4> local_18;
  QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4> local_14;
  QFlagsStorage<QAbstractFileEngine::FileFlag> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QResourceFileEngine *)0x2ea0a9);
  local_c.i = 0xaaaaaaaa;
  QFlags<QAbstractFileEngine::FileFlag>::QFlags((QFlags<QAbstractFileEngine::FileFlag> *)0x2ea0c2);
  bVar1 = QResource::isValid((QResource *)
                             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  if (bVar1) {
    local_14.super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i =
         (QFlagsStorage<QAbstractFileEngine::FileFlag>)
         QFlags<QAbstractFileEngine::FileFlag>::operator&
                   ((QFlags<QAbstractFileEngine::FileFlag> *)
                    CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff8c);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_14);
    if (bVar1) {
      local_1c.super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i =
           (QFlagsStorage<QAbstractFileEngine::FileFlag>)
           ::operator|(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
      local_18.super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i =
           (QFlagsStorage<QAbstractFileEngine::FileFlag>)
           QFlags<QAbstractFileEngine::FileFlag>::operator|
                     ((QFlags<QAbstractFileEngine::FileFlag> *)
                      CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff8c);
      in_stack_ffffffffffffff9c.i =
           (Int)QFlags<QAbstractFileEngine::FileFlag>::operator|
                          ((QFlags<QAbstractFileEngine::FileFlag> *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           in_stack_ffffffffffffff8c);
      QFlags<QAbstractFileEngine::FileFlag>::operator|=
                ((QFlags<QAbstractFileEngine::FileFlag> *)&local_c,
                 (QFlags<QAbstractFileEngine::FileFlag>)in_stack_ffffffffffffff9c.i);
    }
    local_20.super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i =
         (QFlagsStorage<QAbstractFileEngine::FileFlag>)
         QFlags<QAbstractFileEngine::FileFlag>::operator&
                   ((QFlags<QAbstractFileEngine::FileFlag> *)
                    CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff8c);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_20);
    if (bVar1) {
      bVar1 = QResource::isDir((QResource *)
                               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      if (bVar1) {
        QFlags<QAbstractFileEngine::FileFlag>::operator|=
                  ((QFlags<QAbstractFileEngine::FileFlag> *)&local_c,DirectoryType);
      }
      else {
        QFlags<QAbstractFileEngine::FileFlag>::operator|=
                  ((QFlags<QAbstractFileEngine::FileFlag> *)&local_c,FileType);
      }
    }
    local_24.super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i =
         (QFlagsStorage<QAbstractFileEngine::FileFlag>)
         QFlags<QAbstractFileEngine::FileFlag>::operator&
                   ((QFlags<QAbstractFileEngine::FileFlag> *)
                    CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff8c);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_24);
    if (bVar1) {
      QFlags<QAbstractFileEngine::FileFlag>::operator|=
                ((QFlags<QAbstractFileEngine::FileFlag> *)&local_c,ExistsFlag);
      QResource::absoluteFilePath
                ((QResource *)CONCAT44(in_stack_ffffffffffffff9c.i,in_stack_ffffffffffffff98));
      Qt::Literals::StringLiterals::operator____L1
                ((char *)CONCAT44(in_stack_ffffffffffffff9c.i,in_stack_ffffffffffffff98),
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      bVar1 = ::operator==((QString *)
                           CONCAT44(in_stack_ffffffffffffff9c.i,in_stack_ffffffffffffff98),
                           (QLatin1StringView *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      uVar2 = (uint)bVar1 << 0x18;
      QString::~QString((QString *)0x2ea219);
      if ((uVar2 & 0x1000000) != 0) {
        QFlags<QAbstractFileEngine::FileFlag>::operator|=
                  ((QFlags<QAbstractFileEngine::FileFlag> *)&local_c,RootFlag);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>)
         (QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>)local_c.i;
}

Assistant:

QAbstractFileEngine::FileFlags QResourceFileEngine::fileFlags(QAbstractFileEngine::FileFlags type) const
{
    Q_D(const QResourceFileEngine);
    QAbstractFileEngine::FileFlags ret;
    if (!d->resource.isValid())
        return ret;

    if (type & PermsMask)
        ret |= QAbstractFileEngine::FileFlags(ReadOwnerPerm | ReadUserPerm | ReadGroupPerm
                                              | ReadOtherPerm);
    if (type & TypesMask) {
        if (d->resource.isDir())
            ret |= DirectoryType;
        else
            ret |= FileType;
    }
    if (type & FlagsMask) {
        ret |= ExistsFlag;
        if (d->resource.absoluteFilePath() == ":/"_L1)
            ret |= RootFlag;
    }
    return ret;
}